

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

char * SQCompilation::symbolContextName(SymbolKind k)

{
  if (k < (SK_ENUM_CONST|SK_VAR)) {
    return &DAT_0017ef58 + *(int *)(&DAT_0017ef58 + (ulong)k * 4);
  }
  return "<unknown>";
}

Assistant:

static const char *symbolContextName(enum SymbolKind k) {
  switch (k)
  {
  case SK_EXCEPTION: return "exception";
  case SK_FUNCTION: return "function";
  case SK_CLASS: return "class";
  case SK_TABLE: return "table";
  case SK_VAR: return "variable";
  case SK_BINDING: return "let";
  case SK_CONST: return "const";
  case SK_ENUM: return "enum";
  case SK_ENUM_CONST: return "enum const";
  case SK_PARAM: return "parameter";
  case SK_FOREACH: return "foreach var";
  case SK_EXTERNAL_BINDING: return "external binding";
  default: return "<unknown>";
  }
}